

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeMultiplyOp
          (ScalarEvolutionAnalysis *this,Instruction *multiply)

{
  IRContext *this_00;
  DefUseManager *this_01;
  uint32_t uVar1;
  Instruction *pIVar2;
  SENode *pSVar3;
  SENode *operand_2;
  uint uVar4;
  
  if (multiply->opcode_ == OpIMul) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar1 = (multiply->has_result_id_ & 1) + 1;
    if (multiply->has_type_id_ == false) {
      uVar1 = (uint)multiply->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(multiply,uVar1);
    pIVar2 = analysis::DefUseManager::GetDef(this_01,uVar1);
    pSVar3 = AnalyzeInstruction(this,pIVar2);
    uVar4 = (multiply->has_result_id_ & 1) + 1;
    if (multiply->has_type_id_ == false) {
      uVar4 = (uint)multiply->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(multiply,uVar4 + 1);
    pIVar2 = analysis::DefUseManager::GetDef(this_01,uVar1);
    operand_2 = AnalyzeInstruction(this,pIVar2);
    pSVar3 = CreateMultiplyNode(this,pSVar3,operand_2);
    return pSVar3;
  }
  __assert_fail("multiply->opcode() == spv::Op::OpIMul && \"Multiply node did not come from a multiply instruction\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                ,100,
                "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeMultiplyOp(const Instruction *)"
               );
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeMultiplyOp(
    const Instruction* multiply) {
  assert(multiply->opcode() == spv::Op::OpIMul &&
         "Multiply node did not come from a multiply instruction");
  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  SENode* op1 =
      AnalyzeInstruction(def_use->GetDef(multiply->GetSingleWordInOperand(0)));
  SENode* op2 =
      AnalyzeInstruction(def_use->GetDef(multiply->GetSingleWordInOperand(1)));

  return CreateMultiplyNode(op1, op2);
}